

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvoidReinterprets.cpp
# Opt level: O2

void __thiscall
wasm::AvoidReinterprets::optimize(wasm::Function*)::FinalOptimizer::visitLoad(wasm::Load__
          (void *this,Load *curr)

{
  Index IVar1;
  Index index;
  Module *pMVar2;
  uintptr_t uVar3;
  Builder load;
  iterator iVar4;
  Memory *pMVar5;
  LocalGet *pLVar6;
  Load *value;
  Block *expression;
  initializer_list<wasm::Expression_*> local_80;
  LocalSet *local_70;
  LocalSet *local_68;
  Module *local_60;
  Expression *local_58;
  uintptr_t local_50;
  Index local_44;
  Builder local_40;
  Builder builder;
  Load *curr_local;
  
  builder.wasm = (Module *)curr;
  iVar4 = std::
          _Rb_tree<wasm::Load_*,_std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>,_std::_Select1st<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>,_std::less<wasm::Load_*>,_std::allocator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>_>
          ::find(*(_Rb_tree<wasm::Load_*,_std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>,_std::_Select1st<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>,_std::less<wasm::Load_*>,_std::allocator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>_>
                   **)((long)this + 0xd8),(key_type *)&builder);
  if (iVar4._M_node != (_Base_ptr)(*(long *)((long)this + 0xd8) + 8)) {
    pMVar2 = *(Module **)((long)this + 0xe8);
    local_58 = (Expression *)
               ((builder.wasm)->globals).
               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_40.wasm = pMVar2;
    pMVar5 = Module::getMemory(*(Module **)((long)this + 0xd0),
                               (IString)*(IString *)
                                         &((builder.wasm)->globals).
                                          super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish);
    uVar3 = (pMVar5->indexType).id;
    local_44 = *(Index *)((long)&iVar4._M_node[1]._M_parent + 4);
    local_50 = uVar3;
    pLVar6 = MixedArena::alloc<wasm::LocalGet>(&pMVar2->allocator);
    pLVar6->index = local_44;
    (pLVar6->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar3;
    ((builder.wasm)->globals).
    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pLVar6;
    local_70 = Builder::makeLocalSet
                         (&local_40,*(Index *)((long)&iVar4._M_node[1]._M_parent + 4),local_58);
    load = builder;
    IVar1 = *(Index *)((long)&iVar4._M_node[1]._M_parent + 4);
    index = *(Index *)&iVar4._M_node[1]._M_left;
    pLVar6 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
    pLVar6->index = IVar1;
    (pLVar6->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = local_50;
    value = makeReinterpretedLoad(wasm::Load*,wasm::Expression__
                      (this,(Load *)load.wasm,(Expression *)pLVar6);
    local_68 = Builder::makeLocalSet(&local_40,index,(Expression *)value);
    local_80._M_array = (iterator)&local_70;
    local_60 = builder.wasm;
    local_80._M_len = 3;
    expression = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                           (&local_40,&local_80);
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::replaceCurrent
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this,
               (Expression *)expression);
  }
  return;
}

Assistant:

void visitLoad(Load* curr) {
        auto iter = infos.find(curr);
        if (iter != infos.end()) {
          auto& info = iter->second;
          Builder builder(*module);
          auto* ptr = curr->ptr;
          auto mem = getModule()->getMemory(curr->memory);
          auto indexType = mem->indexType;
          curr->ptr = builder.makeLocalGet(info.ptrLocal, indexType);
          // Note that the other load can have its sign set to false - if the
          // original were an integer, the other is a float anyhow; and if
          // original were a float, we don't know what sign to use.
          replaceCurrent(builder.makeBlock(
            {builder.makeLocalSet(info.ptrLocal, ptr),
             builder.makeLocalSet(
               info.reinterpretedLocal,
               makeReinterpretedLoad(
                 curr, builder.makeLocalGet(info.ptrLocal, indexType))),
             curr}));
        }
      }